

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

bool __thiscall glslang::TType::isIntegerDomain(TType *this)

{
  return (bool)((byte)(0x2ff0 >> (this->field_0x8 & 0x1f)) & (byte)this->field_0x8 < 0xe);
}

Assistant:

virtual bool isIntegerDomain() const
    {
        switch (basicType) {
        case EbtInt8:
        case EbtUint8:
        case EbtInt16:
        case EbtUint16:
        case EbtInt:
        case EbtUint:
        case EbtInt64:
        case EbtUint64:
        case EbtAtomicUint:
            return true;
        default:
            break;
        }
        return false;
    }